

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ShaderSubroutine::FunctionalTest16::iterate(FunctionalTest16 *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *pCVar5;
  NotSupportedError *this_00;
  TestError *this_01;
  GLuint local_168;
  GLuint local_164;
  GLuint local_160;
  GLuint local_15c;
  _subroutine_uniform_value_verification local_140 [2];
  _shader_stage *local_138;
  _shader_stage *current_shader_stage;
  uint n_shader_stage;
  _shader_stage *shader_stages [5];
  _subroutine_uniform_value_verification local_f8;
  _test_case local_f4;
  byte local_ed;
  byte local_ec [7];
  bool uses_stage_reset_status;
  bool stage_reset_status [5];
  _shader_stage cached_shader_stage_data;
  GLuint local_a8;
  GLuint GStack_a4;
  GLuint subroutine_configuration [4];
  _shader_stage *current_stage;
  uint n_stage;
  _shader_stage *stages [5];
  uint local_58;
  _test_case local_54;
  uint n_object_id;
  int test_case;
  allocator<char> local_39;
  string local_38;
  long local_18;
  Functions *gl;
  FunctionalTest16 *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar2);
  pCVar5 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_ARB_shader_subroutine");
  if (bVar1) {
    pCVar5 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_ARB_separate_shader_objects");
    this->m_are_pipeline_objects_supported = bVar1;
    initTest(this);
    for (local_54 = TEST_CASE_FIRST; local_54 != TEST_CASE_COUNT;
        local_54 = local_54 + TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_PIPELINE_OBJECT) {
      if ((local_54 == TEST_CASE_FIRST) || ((this->m_are_pipeline_objects_supported & 1U) != 0)) {
        for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
          if (local_54 == TEST_CASE_FIRST) {
            (**(code **)(local_18 + 0x1680))(this->m_po_ids[local_58]);
            dVar3 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar3,"glUseProgram() call failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                            ,0x2114);
          }
          else {
            (**(code **)(local_18 + 0x98))(this->m_pipeline_object_ids[local_58]);
            dVar3 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar3,"glBindProgramPipeline() call failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                            ,0x2119);
          }
          stages[4]._4_4_ = local_54;
          stages[4]._0_4_ = 0;
          verifySubroutineUniformValues
                    (this,(_test_case *)((long)stages + 0x24),&local_58,
                     (_subroutine_uniform_value_verification *)(stages + 4));
          memset(&stack0xffffffffffffff78,0,0x28);
          getShaderStages(this,local_54 == TEST_CASE_FIRST,&local_58,
                          (_shader_stage **)&stack0xffffffffffffff78);
          for (current_stage._4_4_ = 0; current_stage._4_4_ < 5;
              current_stage._4_4_ = current_stage._4_4_ + 1) {
            subroutine_configuration._8_8_ = stages[(ulong)current_stage._4_4_ - 1];
            if (((_shader_stage *)subroutine_configuration._8_8_)->default_subroutine1_value ==
                ((_shader_stage *)subroutine_configuration._8_8_)->function1_index) {
              local_15c = ((_shader_stage *)subroutine_configuration._8_8_)->function2_index;
            }
            else {
              local_15c = ((_shader_stage *)subroutine_configuration._8_8_)->function1_index;
            }
            if (((_shader_stage *)subroutine_configuration._8_8_)->default_subroutine2_value ==
                ((_shader_stage *)subroutine_configuration._8_8_)->function1_index) {
              local_160 = ((_shader_stage *)subroutine_configuration._8_8_)->function2_index;
            }
            else {
              local_160 = ((_shader_stage *)subroutine_configuration._8_8_)->function1_index;
            }
            _local_a8 = CONCAT44(local_160,local_15c);
            if (((_shader_stage *)subroutine_configuration._8_8_)->default_subroutine3_value ==
                ((_shader_stage *)subroutine_configuration._8_8_)->function3_index) {
              local_164 = ((_shader_stage *)subroutine_configuration._8_8_)->function4_index;
            }
            else {
              local_164 = ((_shader_stage *)subroutine_configuration._8_8_)->function3_index;
            }
            if (((_shader_stage *)subroutine_configuration._8_8_)->default_subroutine4_value ==
                ((_shader_stage *)subroutine_configuration._8_8_)->function3_index) {
              local_168 = ((_shader_stage *)subroutine_configuration._8_8_)->function4_index;
            }
            else {
              local_168 = ((_shader_stage *)subroutine_configuration._8_8_)->function3_index;
            }
            subroutine_configuration[1] = local_168;
            subroutine_configuration[0] = local_164;
            (**(code **)(local_18 + 0x1668))
                      (((_shader_stage *)subroutine_configuration._8_8_)->gl_stage,4,&local_a8);
            dVar3 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar3,"glUniformSubroutinesuiv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                            ,0x213e);
          }
          cached_shader_stage_data.gl_stage = local_54;
          cached_shader_stage_data.function4_index = 1;
          verifySubroutineUniformValues
                    (this,&cached_shader_stage_data.gl_stage,&local_58,
                     &cached_shader_stage_data.function4_index);
          local_ec[4] = 0;
          local_ec[0] = 0;
          local_ec[1] = 0;
          local_ec[2] = 0;
          local_ec[3] = 0;
          local_ed = 0;
          switch(local_54) {
          case TEST_CASE_FIRST:
            (**(code **)(local_18 + 0x1680))(this->m_po_ids[local_58 + 1 & 1]);
            (**(code **)(local_18 + 0x1680))(this->m_po_ids[local_58]);
            dVar3 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar3,"glUseProgram() call(s) failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                            ,0x2153);
            break;
          case TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_PIPELINE_OBJECT:
            (**(code **)(local_18 + 0x98))(this->m_pipeline_object_ids[local_58 + 1 & 1]);
            (**(code **)(local_18 + 0x98))(this->m_pipeline_object_ids[local_58]);
            dVar3 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar3,"glBindProgramPipeline() call(s) failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                            ,0x2161);
            break;
          case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_FRAGMENT_STAGE:
            (**(code **)(local_18 + 0x1688))
                      (this->m_pipeline_object_ids[local_58],2,this->m_fs_po_ids[local_58 + 1 & 1]);
            dVar3 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar3,"glUseProgramStages() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                            ,0x216f);
            memcpy(stage_reset_status,this->m_fs_po_descriptors + local_58,0x34);
            memcpy(this->m_fs_po_descriptors + local_58,
                   this->m_fs_po_descriptors + (local_58 + 1 & 1),0x34);
            local_ec[4] = 1;
            local_ed = 1;
            break;
          case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_GEOMETRY_STAGE:
            (**(code **)(local_18 + 0x1688))
                      (this->m_pipeline_object_ids[local_58],4,this->m_gs_po_ids[local_58 + 1 & 1]);
            dVar3 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar3,"glUseProgramStages() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                            ,0x2183);
            memcpy(stage_reset_status,this->m_gs_po_descriptors + local_58,0x34);
            memcpy(this->m_gs_po_descriptors + local_58,
                   this->m_gs_po_descriptors + (local_58 + 1 & 1),0x34);
            local_ec[3] = 1;
            local_ed = 1;
            break;
          case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_TESS_CONTROL_STAGE:
            (**(code **)(local_18 + 0x1688))
                      (this->m_pipeline_object_ids[local_58],8,this->m_tc_po_ids[local_58 + 1 & 1]);
            dVar3 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar3,"glUseProgramStages() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                            ,0x2197);
            memcpy(stage_reset_status,this->m_tc_po_descriptors + local_58,0x34);
            memcpy(this->m_tc_po_descriptors + local_58,
                   this->m_tc_po_descriptors + (local_58 + 1 & 1),0x34);
            local_ec[1] = 1;
            local_ed = 1;
            break;
          case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_TESS_EVALUATION_STAGE:
            (**(code **)(local_18 + 0x1688))
                      (this->m_pipeline_object_ids[local_58],0x10,
                       this->m_te_po_ids[local_58 + 1 & 1]);
            dVar3 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar3,"glUseProgramStages() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                            ,0x21ab);
            memcpy(stage_reset_status,this->m_te_po_descriptors + local_58,0x34);
            memcpy(this->m_te_po_descriptors + local_58,
                   this->m_te_po_descriptors + (local_58 + 1 & 1),0x34);
            local_ec[2] = 1;
            local_ed = 1;
            break;
          case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_VERTEX_STAGE:
            (**(code **)(local_18 + 0x1688))
                      (this->m_pipeline_object_ids[local_58],1,this->m_vs_po_ids[local_58 + 1 & 1]);
            dVar3 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar3,"glUseProgramStages() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                            ,0x21bf);
            memcpy(stage_reset_status,this->m_vs_po_descriptors + local_58,0x34);
            memcpy(this->m_vs_po_descriptors + local_58,
                   this->m_vs_po_descriptors + (local_58 + 1 & 1),0x34);
            local_ec[0] = 1;
            local_ed = 1;
            break;
          default:
            this_01 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_01,"Unrecognized test case",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                       ,0x21cc);
            __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          if ((local_ed & 1) == 0) {
            local_f4 = local_54;
            local_f8 = SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES;
            verifySubroutineUniformValues(this,&local_f4,&local_58,&local_f8);
          }
          else {
            memset(&stack0xfffffffffffffed8,0,0x28);
            getShaderStages(this,local_54 == TEST_CASE_FIRST,&local_58,
                            (_shader_stage **)&stack0xfffffffffffffed8);
            for (current_shader_stage._4_4_ = 0; current_shader_stage._4_4_ < 5;
                current_shader_stage._4_4_ = current_shader_stage._4_4_ + 1) {
              local_138 = shader_stages[(ulong)current_shader_stage._4_4_ - 1];
              if ((local_ec[current_shader_stage._4_4_] & 1) == 0) {
                local_140[0] = SUBROUTINE_UNIFORMS_SET_TO_NONDEFAULT_VALUES;
                verifySubroutineUniformValuesForShaderStage(this,local_138,local_140);
              }
              else {
                local_140[1] = 0;
                verifySubroutineUniformValuesForShaderStage(this,local_138,local_140 + 1);
              }
            }
          }
          switch(local_54) {
          case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_FRAGMENT_STAGE:
            (**(code **)(local_18 + 0x1688))
                      (this->m_pipeline_object_ids[local_58],2,this->m_fs_po_ids[local_58]);
            dVar3 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar3,"glUseProgramStages() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                            ,0x21f5);
            memcpy(this->m_fs_po_descriptors + local_58,stage_reset_status,0x34);
            break;
          case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_GEOMETRY_STAGE:
            (**(code **)(local_18 + 0x1688))
                      (this->m_pipeline_object_ids[local_58],4,this->m_gs_po_ids[local_58]);
            dVar3 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar3,"glUseProgramStages() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                            ,0x2200);
            memcpy(this->m_gs_po_descriptors + local_58,stage_reset_status,0x34);
            break;
          case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_TESS_CONTROL_STAGE:
            (**(code **)(local_18 + 0x1688))
                      (this->m_pipeline_object_ids[local_58],8,this->m_tc_po_ids[local_58]);
            dVar3 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar3,"glUseProgramStages() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                            ,0x220b);
            memcpy(this->m_tc_po_descriptors + local_58,stage_reset_status,0x34);
            break;
          case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_TESS_EVALUATION_STAGE:
            (**(code **)(local_18 + 0x1688))
                      (this->m_pipeline_object_ids[local_58],0x10,this->m_te_po_ids[local_58]);
            dVar3 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar3,"glUseProgramStages() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                            ,0x2216);
            memcpy(this->m_te_po_descriptors + local_58,stage_reset_status,0x34);
            break;
          case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_VERTEX_STAGE:
            (**(code **)(local_18 + 0x1688))
                      (this->m_pipeline_object_ids[local_58],1,this->m_vs_po_ids[local_58]);
            dVar3 = (**(code **)(local_18 + 0x800))();
            glu::checkError(dVar3,"glUseProgramStages() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                            ,0x2220);
            memcpy(this->m_vs_po_descriptors + local_58,stage_reset_status,0x34);
          }
        }
        (**(code **)(local_18 + 0x1680))(0);
        dVar3 = (**(code **)(local_18 + 0x800))();
        glu::checkError(dVar3,"glUseProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x222f);
      }
    }
    if ((this->m_has_test_passed & 1U) == 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    return STOP;
  }
  n_object_id._3_1_ = 1;
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GL_ARB_shader_subroutine is not supported.",&local_39);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  n_object_id._3_1_ = 0;
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest16::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	m_are_pipeline_objects_supported =
		m_context.getContextInfo().isExtensionSupported("GL_ARB_separate_shader_objects");

	/* Initialize GL objects required to run the test */
	initTest();

	/* Iterate over both pipelines/programs and verify that calling glUseProgram() /
	 * glBindProgramPipeline() / glUseProgramStages() resets subroutine uniform configuration.
	 */
	for (int test_case = static_cast<int>(TEST_CASE_FIRST); test_case != static_cast<int>(TEST_CASE_COUNT); ++test_case)
	{
		if (static_cast<_test_case>(test_case) != TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_OBJECT &&
			!m_are_pipeline_objects_supported)
		{
			/* Current test case requires GL_ARB_separate_shader_objects support which is
			 * unavaiable on the platform that we're testing
			 */
			continue;
		}

		for (unsigned int n_object_id = 0; n_object_id < 2; /* pipeline/program objects allocated for the test */
			 ++n_object_id)
		{
			/* Verify that currently reported subroutine uniform values are equal to default values */
			if (test_case == TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_OBJECT)
			{
				gl.useProgram(m_po_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");
			}
			else
			{
				gl.bindProgramPipeline(m_pipeline_object_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed");
			}

			verifySubroutineUniformValues(static_cast<_test_case>(test_case), n_object_id,
										  SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES);

			/* Re-configure subroutine uniforms so that they point to different subroutines than
			 * the default ones.
			 */
			const _shader_stage* stages[5 /* fs+gs+tc+te+vs */] = { DE_NULL };

			getShaderStages(static_cast<_test_case>(test_case) == TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_OBJECT,
							n_object_id, stages);

			for (unsigned int n_stage = 0; n_stage < 5 /* fs+gs+tc+te+vs stages */; ++n_stage)
			{
				const _shader_stage& current_stage				 = *(stages[n_stage]);
				glw::GLuint			 subroutine_configuration[4] = { GL_INVALID_INDEX };

				subroutine_configuration[0] =
					(current_stage.default_subroutine1_value == current_stage.function1_index) ?
						current_stage.function2_index :
						current_stage.function1_index;
				subroutine_configuration[1] =
					(current_stage.default_subroutine2_value == current_stage.function1_index) ?
						current_stage.function2_index :
						current_stage.function1_index;
				subroutine_configuration[2] =
					(current_stage.default_subroutine3_value == current_stage.function3_index) ?
						current_stage.function4_index :
						current_stage.function3_index;
				subroutine_configuration[3] =
					(current_stage.default_subroutine4_value == current_stage.function3_index) ?
						current_stage.function4_index :
						current_stage.function3_index;

				gl.uniformSubroutinesuiv(current_stage.gl_stage, 4 /* count */, subroutine_configuration);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformSubroutinesuiv() call failed.");
			} /* for (all stages) */

			verifySubroutineUniformValues(static_cast<_test_case>(test_case), n_object_id,
										  SUBROUTINE_UNIFORMS_SET_TO_NONDEFAULT_VALUES);

			/* Execute test case-specific code */
			_shader_stage cached_shader_stage_data;
			bool		  stage_reset_status[Utils::SHADER_STAGE_COUNT] = { false, false, false, false, false };
			bool		  uses_stage_reset_status						= false;

			switch (test_case)
			{
			case TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_OBJECT:
			{
				/* Switch to a different program object and then back to current PO.
				 * Subroutine uniforms should be back at their default settings, instead of
				 * the ones we've just set.
				 */
				gl.useProgram(m_po_ids[(n_object_id + 1) % 2 /* objects allocated for the test */]);
				gl.useProgram(m_po_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call(s) failed.");

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_PIPELINE_OBJECT:
			{
				/* Switch to a different pipeline object and then back to the current one.
				 * Subroutine uniforms should be back at their default settings, instead of
				 * the ones we've just set.
				 */
				gl.bindProgramPipeline(
					m_pipeline_object_ids[(n_object_id + 1) % 2 /* objects allocated for the test */]);
				gl.bindProgramPipeline(m_pipeline_object_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call(s) failed.");

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_FRAGMENT_STAGE:
			{
				/* Change the fragment shader stage to a different one.
				 *
				 * Note: We also need to update internal descriptor since the subroutine/uniform
				 *       locations may be different between the two programs.
				 */
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_FRAGMENT_SHADER_BIT,
									m_fs_po_ids[(n_object_id + 1) % 2 /* objects allocated for the test */]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				cached_shader_stage_data		 = m_fs_po_descriptors[n_object_id];
				m_fs_po_descriptors[n_object_id] = m_fs_po_descriptors[(n_object_id + 1) % 2];

				stage_reset_status[Utils::SHADER_STAGE_FRAGMENT] = true;
				uses_stage_reset_status							 = true;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_GEOMETRY_STAGE:
			{
				/* Change the geometry shader stage to a different one.
				 *
				 * Note: We also need to update internal descriptor since the subroutine/uniform
				 *       locations may be different between the two programs.
				 */
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_GEOMETRY_SHADER_BIT,
									m_gs_po_ids[(n_object_id + 1) % 2 /* objects allocated for the test */]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				cached_shader_stage_data		 = m_gs_po_descriptors[n_object_id];
				m_gs_po_descriptors[n_object_id] = m_gs_po_descriptors[(n_object_id + 1) % 2];

				stage_reset_status[Utils::SHADER_STAGE_GEOMETRY] = true;
				uses_stage_reset_status							 = true;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_TESS_CONTROL_STAGE:
			{
				/* Change the tessellation control shader stage to a different one.
				 *
				 * Note: We also need to update internal descriptor since the subroutine/uniform
				 *       locations may be different between the two programs.
				 */
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_TESS_CONTROL_SHADER_BIT,
									m_tc_po_ids[(n_object_id + 1) % 2 /* objects allocated for the test */]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				cached_shader_stage_data		 = m_tc_po_descriptors[n_object_id];
				m_tc_po_descriptors[n_object_id] = m_tc_po_descriptors[(n_object_id + 1) % 2];

				stage_reset_status[Utils::SHADER_STAGE_TESSELLATION_CONTROL] = true;
				uses_stage_reset_status										 = true;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_TESS_EVALUATION_STAGE:
			{
				/* Change the tessellation evaluation shader stage to a different one.
				 *
				 * Note: We also need to update internal descriptor since the subroutine/uniform
				 *       locations may be different between the two programs.
				 */
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_TESS_EVALUATION_SHADER_BIT,
									m_te_po_ids[(n_object_id + 1) % 2 /* objects allocated for the test */]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				cached_shader_stage_data		 = m_te_po_descriptors[n_object_id];
				m_te_po_descriptors[n_object_id] = m_te_po_descriptors[(n_object_id + 1) % 2];

				stage_reset_status[Utils::SHADER_STAGE_TESSELLATION_EVALUATION] = true;
				uses_stage_reset_status											= true;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_VERTEX_STAGE:
			{
				/* Change the vertex shader stage to a different one.
				 *
				 * Note: We also need to update internal descriptor since the subroutine/uniform
				 *       locations may be different between the two programs.
				 */
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_VERTEX_SHADER_BIT,
									m_vs_po_ids[(n_object_id + 1) % 2 /* objects allocated for the test */]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				cached_shader_stage_data		 = m_vs_po_descriptors[n_object_id];
				m_vs_po_descriptors[n_object_id] = m_vs_po_descriptors[(n_object_id + 1) % 2];

				stage_reset_status[Utils::SHADER_STAGE_VERTEX] = true;
				uses_stage_reset_status						   = true;

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized test case");
			}
			} /* switch (test_case) */

			/* Verify the subroutine uniform values are valid */
			if (!uses_stage_reset_status)
			{
				verifySubroutineUniformValues(static_cast<_test_case>(test_case), n_object_id,
											  SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES);
			}
			else
			{
				const _shader_stage* shader_stages[Utils::SHADER_STAGE_COUNT] = { DE_NULL };

				getShaderStages(static_cast<_test_case>(test_case) == TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_OBJECT,
								n_object_id, shader_stages);

				for (unsigned int n_shader_stage = 0; n_shader_stage < Utils::SHADER_STAGE_COUNT; ++n_shader_stage)
				{
					const _shader_stage& current_shader_stage = *(shader_stages[n_shader_stage]);

					if (stage_reset_status[n_shader_stage])
					{
						verifySubroutineUniformValuesForShaderStage(current_shader_stage,
																	SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES);
					}
					else
					{
						verifySubroutineUniformValuesForShaderStage(current_shader_stage,
																	SUBROUTINE_UNIFORMS_SET_TO_NONDEFAULT_VALUES);
					}
				} /* for (all shader stages) */
			}

			/* Revert the changes some of the test cases appied */
			switch (test_case)
			{
			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_FRAGMENT_STAGE:
			{
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_FRAGMENT_SHADER_BIT,
									m_fs_po_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				m_fs_po_descriptors[n_object_id] = cached_shader_stage_data;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_GEOMETRY_STAGE:
			{
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_GEOMETRY_SHADER_BIT,
									m_gs_po_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				m_gs_po_descriptors[n_object_id] = cached_shader_stage_data;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_TESS_CONTROL_STAGE:
			{
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_TESS_CONTROL_SHADER_BIT,
									m_tc_po_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				m_tc_po_descriptors[n_object_id] = cached_shader_stage_data;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_TESS_EVALUATION_STAGE:
			{
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_TESS_EVALUATION_SHADER_BIT,
									m_te_po_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				m_te_po_descriptors[n_object_id] = cached_shader_stage_data;

				break;
			}

			case TEST_CASE_SWITCH_TO_DIFFERENT_PIPELINE_VERTEX_STAGE:
			{
				gl.useProgramStages(m_pipeline_object_ids[n_object_id], GL_VERTEX_SHADER_BIT, m_vs_po_ids[n_object_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

				m_vs_po_descriptors[n_object_id] = cached_shader_stage_data;

				break;
			}

			default:
				break;
			} /* switch (test_case) */

		} /* for (all program object descriptors) */

		/* Unbind the program object */
		gl.useProgram(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");
	} /* for (all test cases) */

	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}